

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

void __thiscall PDA::toDot(PDA *this,string *filename)

{
  bool bVar1;
  char c;
  reference ppSVar2;
  reference ppTVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  State *pSVar4;
  string *psVar5;
  string *psVar6;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  Connection local_500;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  Node local_400;
  Connection local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  string local_308;
  string local_2e8;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string connectionString;
  __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
  local_1e0;
  iterator connection;
  string local_1d0;
  Node local_1b0;
  allocator<char> local_119;
  string local_118;
  Node local_f8;
  __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_> local_78;
  __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_> local_70;
  iterator state;
  Graph graph;
  string *filename_local;
  PDA *this_local;
  
  memset(&state,0,0x50);
  Graph::Graph((Graph *)&state);
  local_70._M_current =
       (State **)std::vector<State_*,_std::allocator<State_*>_>::begin(&this->statesQ);
  while( true ) {
    local_78._M_current =
         (State **)std::vector<State_*,_std::allocator<State_*>_>::end(&this->statesQ);
    bVar1 = __gnu_cxx::operator!=(&local_70,&local_78);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
              operator*(&local_70);
    bVar1 = isEndState(this,*ppSVar2);
    if (bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&local_70);
      psVar6 = State::getName_abi_cxx11_(*ppSVar2);
      ppSVar2 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&local_70);
      psVar5 = State::getName_abi_cxx11_(*ppSVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"doublecircle",&local_119);
      Node::Node(&local_f8,psVar6,psVar5,&local_118);
      Graph::addNode((Graph *)&state,&local_f8);
      Node::~Node(&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    else {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&local_70);
      psVar6 = State::getName_abi_cxx11_(*ppSVar2);
      ppSVar2 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&local_70);
      psVar5 = State::getName_abi_cxx11_(*ppSVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"circle",(allocator<char> *)((long)&connection._M_current + 7)
                );
      Node::Node(&local_1b0,psVar6,psVar5,&local_1d0);
      Graph::addNode((Graph *)&state,&local_1b0);
      Node::~Node(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&connection._M_current + 7));
    }
    __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
    operator++(&local_70);
  }
  local_1e0._M_current =
       (Transition **)
       std::vector<Transition_*,_std::allocator<Transition_*>_>::begin(&this->transitionFunctionD);
  while( true ) {
    connectionString.field_2._8_8_ =
         std::vector<Transition_*,_std::allocator<Transition_*>_>::end(&this->transitionFunctionD);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1e0,
                       (__normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
                        *)((long)&connectionString.field_2 + 8));
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
              ::operator*(&local_1e0);
    c = Transition::getInput(*ppTVar3);
    toString_abi_cxx11_(&local_2c8,c);
    std::operator+(&local_2a8,"\"(",&local_2c8);
    std::operator+(&local_288,&local_2a8,", ");
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
              ::operator*(&local_1e0);
    Transition::getStackInput_abi_cxx11_(&local_2e8,*ppTVar3);
    std::operator+(&local_268,&local_288,&local_2e8);
    std::operator+(&local_248,&local_268,"/");
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
              ::operator*(&local_1e0);
    __x = Transition::getStackPush_abi_cxx11_(*ppTVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_320,__x);
    toString(&local_308,&local_320);
    std::operator+(&local_228,&local_248,&local_308);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &local_228,")\"");
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_308);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_320);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
              ::operator*(&local_1e0);
    pSVar4 = Transition::getStateFrom(*ppTVar3);
    psVar6 = State::getName_abi_cxx11_(pSVar4);
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
              ::operator*(&local_1e0);
    pSVar4 = Transition::getStateTo(*ppTVar3);
    psVar5 = State::getName_abi_cxx11_(pSVar4);
    Connection::Connection(&local_380,psVar6,psVar5,(string *)local_208);
    Graph::addConnection((Graph *)&state,&local_380);
    Connection::~Connection(&local_380);
    std::__cxx11::string::~string((string *)local_208);
    __gnu_cxx::
    __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>::
    operator++(&local_1e0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"invis",&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"invis",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"circle",&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"style=invis",&local_499);
  Node::Node(&local_400,&local_420,&local_448,&local_470,&local_498);
  Graph::addNode((Graph *)&state,&local_400);
  Node::~Node(&local_400);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"invis",&local_521);
  psVar6 = State::getName_abi_cxx11_(this->startState);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"Start",&local_549);
  Connection::Connection(&local_500,&local_520,psVar6,&local_548);
  Graph::addConnection((Graph *)&state,&local_500);
  Connection::~Connection(&local_500);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::__cxx11::string::string((string *)&local_570,(string *)filename);
  Graph::build_file((Graph *)&state,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  Graph::~Graph((Graph *)&state);
  return;
}

Assistant:

void PDA::toDot(std::string filename) {
    Graph graph = Graph();
    for (vector<State *>::iterator state = statesQ.begin(); state != statesQ.end(); ++state) {
        if (isEndState(*state)) {
            graph.addNode(Node((*state)->getName(), (*state)->getName(), "doublecircle"));
        } else {
            graph.addNode(Node((*state)->getName(), (*state)->getName(), "circle"));
        }
    }

    for (vector<Transition *>::iterator connection = transitionFunctionD.begin();
         connection != transitionFunctionD.end(); ++connection) {
        std::string connectionString =
                "\"(" + toString((*connection)->getInput()) + ", " + (*connection)->getStackInput() +
                "/" +
                toString((*connection)->getStackPush()) + ")\"";
        graph.addConnection(Connection((*connection)->getStateFrom()->getName(), (*connection)->getStateTo()->getName(),
                                       connectionString));
    }

    graph.addNode(Node("invis", "invis", "circle", "style=invis"));
    graph.addConnection(Connection("invis", startState->getName(), "Start"));
    graph.build_file(filename);
}